

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O3

QPDFObjectHandle __thiscall
QPDFPageObjectHelper::getAttribute
          (QPDFPageObjectHelper *this,string *name,bool copy_if_shared,
          function<QPDFObjectHandle_()> *get_fallback,bool copy_if_fallback)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  QPDFObjGen og;
  undefined7 in_register_00000011;
  undefined8 uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  undefined7 in_register_00000081;
  undefined4 in_R9D;
  char cVar12;
  char *__end;
  long lVar13;
  QPDFObjectHandle QVar14;
  QPDFObjectHandle dict;
  string local_d8;
  undefined1 local_b8 [24];
  _Rb_tree_node_base _Stack_a0;
  undefined8 local_80;
  undefined4 local_70;
  undefined4 local_6c;
  string local_68;
  QPDFObjectHandle local_48;
  long local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  
  uVar10 = CONCAT71(in_register_00000011,copy_if_shared);
  lVar13 = CONCAT71(in_register_00000081,copy_if_fallback);
  local_6c = SUB84(get_fallback,0);
  local_b8._16_8_ = name->_M_string_length;
  _Stack_a0._0_8_ = (name->field_2)._M_allocated_capacity;
  if ((element_type *)_Stack_a0._0_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      puVar1 = (undefined1 *)
               ((long)&(((element_type *)_Stack_a0._0_8_)->value).
                       super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               + 8);
      *(int *)puVar1 = *(int *)puVar1 + 1;
      UNLOCK();
    }
    else {
      puVar1 = (undefined1 *)
               ((long)&(((element_type *)_Stack_a0._0_8_)->value).
                       super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               + 8);
      *(int *)puVar1 = *(int *)puVar1 + 1;
    }
  }
  bVar8 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)(local_b8 + 0x10));
  if ((element_type *)_Stack_a0._0_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_a0._0_8_);
  }
  if (bVar8) {
    local_b8._16_8_ = name->_M_string_length;
    _Stack_a0._0_8_ = (name->field_2)._M_allocated_capacity;
    if ((element_type *)_Stack_a0._0_8_ != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        puVar1 = (undefined1 *)
                 ((long)&(((element_type *)_Stack_a0._0_8_)->value).
                         super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                         .
                         super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                         .
                         super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 + 8);
        *(int *)puVar1 = *(int *)puVar1 + 1;
        UNLOCK();
      }
      else {
        puVar1 = (undefined1 *)
                 ((long)&(((element_type *)_Stack_a0._0_8_)->value).
                         super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                         .
                         super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                         .
                         super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 + 8);
        *(int *)puVar1 = *(int *)puVar1 + 1;
      }
    }
    QPDFObjectHandle::getDict((QPDFObjectHandle *)local_b8);
    if ((element_type *)_Stack_a0._0_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_a0._0_8_);
    }
  }
  else {
    local_b8._0_8_ = name->_M_string_length;
    local_b8._8_8_ = (name->field_2)._M_allocated_capacity;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count + 1;
      }
    }
  }
  QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_b8);
  if (bVar8) {
LAB_001d4057:
    bVar8 = false;
    cVar12 = (char)in_R9D;
  }
  else {
    bVar8 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this);
    if (!bVar8) goto LAB_001d4057;
    iVar9 = std::__cxx11::string::compare((char *)uVar10);
    if (iVar9 != 0) {
      iVar9 = std::__cxx11::string::compare((char *)uVar10);
      if (iVar9 != 0) {
        iVar9 = std::__cxx11::string::compare((char *)uVar10);
        if (iVar9 != 0) {
          iVar9 = std::__cxx11::string::compare((char *)uVar10);
          if (iVar9 != 0) goto LAB_001d4057;
        }
      }
    }
    local_68._M_dataplus._M_p = (pointer)local_b8._0_8_;
    local_68._M_string_length = local_b8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_b8._8_8_ + 8) = *(_Atomic_word *)(local_b8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_b8._8_8_ + 8) = *(_Atomic_word *)(local_b8._8_8_ + 8) + 1;
      }
    }
    _Stack_a0._M_left = &_Stack_a0;
    local_b8._16_8_ = (_func_int **)0x0;
    _Stack_a0._0_8_ = (element_type *)0x0;
    _Stack_a0._M_parent = (_Base_ptr)0x0;
    local_80 = 0;
    paVar2 = &local_d8.field_2;
    _Stack_a0._M_right = _Stack_a0._M_left;
    local_70 = in_R9D;
    local_68.field_2._8_8_ = uVar10;
    local_38 = lVar13;
    do {
      og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)&local_68);
      bVar8 = QPDFObjGen::set::add((set *)(local_b8 + 0x10),og);
      if (!bVar8) {
LAB_001d4352:
        bVar8 = false;
        goto LAB_001d4354;
      }
      local_d8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/Parent","");
      bVar8 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_68,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar8) goto LAB_001d4352;
      local_d8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/Parent","");
      QPDFObjectHandle::getKey(&local_48,&local_68);
      _Var11._M_pi = local_48.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_68._M_dataplus._M_p =
           (pointer)local_48.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      sVar5 = local_68._M_string_length;
      local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_68._M_string_length = (size_type)_Var11._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5);
        if (local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_d8,&local_68);
      sVar5 = local_d8._M_string_length;
      _Var4._M_p = local_d8._M_dataplus._M_p;
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length = 0;
      peVar3 = (this->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper = (_func_int **)_Var4._M_p;
      (this->super_QPDFObjectHelper).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar5;
      if (peVar3 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3);
        if ((element_type *)local_d8._M_string_length != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
        }
      }
      bVar8 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this);
    } while (bVar8);
    bVar8 = true;
LAB_001d4354:
    std::
    _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
    ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                 *)(local_b8 + 0x10));
    lVar13 = local_38;
    uVar10 = local_68.field_2._8_8_;
    cVar12 = (char)local_70;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
    }
  }
  if ((char)local_6c != '\0') {
    if (!bVar8) {
      bVar8 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)this);
      if (!bVar8) goto LAB_001d40cd;
    }
    QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)&local_d8);
    QPDFObjectHandle::replaceKeyAndGetNew
              ((QPDFObjectHandle *)(local_b8 + 0x10),(string *)local_b8,(QPDFObjectHandle *)uVar10);
    uVar7 = _Stack_a0._0_8_;
    uVar6 = local_b8._16_8_;
    local_b8._16_8_ = (_func_int **)0x0;
    _Stack_a0._0_8_ = (element_type *)0x0;
    peVar3 = (this->super_QPDFObjectHelper).super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper = (_func_int **)uVar6;
    (this->super_QPDFObjectHelper).super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar7;
    if (peVar3 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3);
      if ((element_type *)_Stack_a0._0_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_a0._0_8_);
      }
    }
    if ((element_type *)local_d8._M_string_length != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
    }
  }
LAB_001d40cd:
  bVar8 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this);
  _Var11._M_pi = extraout_RDX;
  if ((bVar8) && (*(long *)(lVar13 + 0x10) != 0)) {
    (**(code **)(lVar13 + 0x18))(local_b8 + 0x10,lVar13);
    uVar7 = _Stack_a0._0_8_;
    uVar6 = local_b8._16_8_;
    local_b8._16_8_ = (_func_int **)0x0;
    _Stack_a0._0_8_ = (element_type *)0x0;
    peVar3 = (this->super_QPDFObjectHelper).super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper = (_func_int **)uVar6;
    (this->super_QPDFObjectHelper).super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar7;
    _Var11._M_pi = extraout_RDX_00;
    if (peVar3 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3);
      _Var11._M_pi = extraout_RDX_01;
      if ((element_type *)_Stack_a0._0_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_a0._0_8_);
        _Var11._M_pi = extraout_RDX_02;
      }
    }
    if (cVar12 != '\0') {
      bVar8 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this);
      _Var11._M_pi = extraout_RDX_03;
      if (!bVar8) {
        QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)&local_d8);
        QVar14 = QPDFObjectHandle::replaceKeyAndGetNew
                           ((QPDFObjectHandle *)(local_b8 + 0x10),(string *)local_b8,
                            (QPDFObjectHandle *)uVar10);
        uVar6 = _Stack_a0._0_8_;
        uVar10 = local_b8._16_8_;
        _Var11._M_pi = QVar14.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_b8._16_8_ = (_func_int **)0x0;
        _Stack_a0._0_8_ = (element_type *)0x0;
        peVar3 = (this->super_QPDFObjectHelper).super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper = (_func_int **)uVar10;
        (this->super_QPDFObjectHelper).super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar6;
        if (peVar3 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3);
          _Var11._M_pi = extraout_RDX_04;
          if ((element_type *)_Stack_a0._0_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_a0._0_8_);
            _Var11._M_pi = extraout_RDX_05;
          }
        }
        if ((element_type *)local_d8._M_string_length != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
          _Var11._M_pi = extraout_RDX_06;
        }
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    _Var11._M_pi = extraout_RDX_07;
  }
  QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var11._M_pi;
  QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageObjectHelper::getAttribute(
    std::string const& name,
    bool copy_if_shared,
    std::function<QPDFObjectHandle()> get_fallback,
    bool copy_if_fallback)
{
    const bool is_form_xobject = oh().isFormXObject();
    bool inherited = false;
    auto dict = is_form_xobject ? oh().getDict() : oh();
    auto result = dict.getKey(name);

    if (!is_form_xobject && result.isNull() &&
        (name == "/MediaBox" || name == "/CropBox" || name == "/Resources" || name == "/Rotate")) {
        QPDFObjectHandle node = dict;
        QPDFObjGen::set seen{};
        while (seen.add(node) && node.hasKey("/Parent")) {
            node = node.getKey("/Parent");
            result = node.getKey(name);
            if (!result.isNull()) {
                QTC::TC("qpdf", "QPDFPageObjectHelper non-trivial inheritance");
                inherited = true;
                break;
            }
        }
    }
    if (copy_if_shared && (inherited || result.isIndirect())) {
        QTC::TC("qpdf", "QPDFPageObjectHelper copy shared attribute", is_form_xobject ? 0 : 1);
        result = dict.replaceKeyAndGetNew(name, result.shallowCopy());
    }
    if (result.isNull() && get_fallback) {
        result = get_fallback();
        if (copy_if_fallback && !result.isNull()) {
            QTC::TC("qpdf", "QPDFPageObjectHelper copied fallback");
            result = dict.replaceKeyAndGetNew(name, result.shallowCopy());
        } else {
            QTC::TC("qpdf", "QPDFPageObjectHelper used fallback without copying");
        }
    }
    return result;
}